

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBufferTestUtil.cpp
# Opt level: O2

void __thiscall
deqp::gls::BufferTestUtil::BufferWriter::BufferWriter
          (BufferWriter *this,RenderContext *renderCtx,TestLog *log,WriteType writeType)

{
  BufferWriterBase *this_00;
  TestError *this_01;
  
  this->m_writer = (BufferWriterBase *)0x0;
  if (writeType == WRITE_BUFFER_WRITE_MAP) {
    this_00 = (BufferWriterBase *)operator_new(0x28);
    BufferWriteMapWriter::BufferWriteMapWriter((BufferWriteMapWriter *)this_00,renderCtx,log);
  }
  else {
    if (writeType != WRITE_BUFFER_SUB_DATA) {
      this_01 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_01,"Unsupported writer",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBufferTestUtil.cpp"
                 ,0x113);
      __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    this_00 = (BufferWriterBase *)operator_new(0x28);
    BufferSubDataWriter::BufferSubDataWriter((BufferSubDataWriter *)this_00,renderCtx,log);
  }
  this->m_writer = this_00;
  return;
}

Assistant:

BufferWriter::BufferWriter (glu::RenderContext& renderCtx, tcu::TestLog& log, WriteType writeType)
	: m_writer(DE_NULL)
{
	switch (writeType)
	{
		case WRITE_BUFFER_SUB_DATA:		m_writer = new BufferSubDataWriter	(renderCtx, log);	break;
		case WRITE_BUFFER_WRITE_MAP:	m_writer = new BufferWriteMapWriter	(renderCtx, log);	break;
		default:
			TCU_FAIL("Unsupported writer");
	}
}